

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O3

void ggml_compute_forward_relu(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  ggml_type gVar3;
  int iVar4;
  int iVar5;
  ggml_tensor *pgVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  void *pvVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  byte bVar31;
  char cVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  char *pcVar38;
  long lVar39;
  int64_t nth_1;
  ushort uVar40;
  undefined8 uVar41;
  int64_t ir;
  long lVar42;
  long lVar43;
  int64_t nth;
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  anon_union_4_2_947300a4 u;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar44 [32];
  
  pgVar6 = dst->src[0];
  gVar2 = dst->type;
  gVar3 = pgVar6->type;
  if (gVar3 == GGML_TYPE_BF16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar6->nb[0] == 2) {
            sVar7 = pgVar6->nb[2];
            sVar8 = pgVar6->nb[3];
            sVar9 = pgVar6->nb[1];
            lVar10 = pgVar6->ne[1];
            lVar43 = pgVar6->ne[2];
            lVar11 = dst->ne[0];
            sVar12 = dst->nb[1];
            sVar13 = dst->nb[2];
            sVar14 = dst->nb[3];
            iVar4 = params->ith;
            iVar5 = params->nth;
            lVar33 = ggml_nrows(pgVar6);
            lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
            lVar42 = iVar4 * lVar34;
            lVar34 = lVar34 + lVar42;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar42 < lVar34) {
              auVar46 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              pvVar15 = pgVar6->data;
              lVar43 = lVar43 * lVar10;
              pvVar16 = dst->data;
              auVar48 = vpbroadcastq_avx512f();
              do {
                lVar33 = lVar42 / lVar43;
                lVar39 = lVar42 % lVar43;
                lVar35 = lVar39 / lVar10;
                lVar39 = lVar39 % lVar10;
                if (0 < lVar11) {
                  uVar37 = 0;
                  do {
                    auVar49 = vpbroadcastq_avx512f();
                    auVar50 = vporq_avx512f(auVar49,auVar46);
                    auVar49 = vporq_avx512f(auVar49,auVar47);
                    uVar41 = vpcmpuq_avx512f(auVar49,auVar48,2);
                    bVar30 = (byte)uVar41;
                    uVar41 = vpcmpuq_avx512f(auVar50,auVar48,2);
                    bVar31 = (byte)uVar41;
                    uVar40 = CONCAT11(bVar31,bVar30);
                    auVar44 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                  ((long)pvVar15 +
                                                  uVar37 * 2 +
                                                  lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8))
                    ;
                    auVar45._2_2_ = (ushort)((byte)(uVar40 >> 1) & 1) * auVar44._2_2_;
                    auVar45._0_2_ = (ushort)(bVar30 & 1) * auVar44._0_2_;
                    auVar45._4_2_ = (ushort)((byte)(uVar40 >> 2) & 1) * auVar44._4_2_;
                    auVar45._6_2_ = (ushort)((byte)(uVar40 >> 3) & 1) * auVar44._6_2_;
                    auVar45._8_2_ = (ushort)((byte)(uVar40 >> 4) & 1) * auVar44._8_2_;
                    auVar45._10_2_ = (ushort)((byte)(uVar40 >> 5) & 1) * auVar44._10_2_;
                    auVar45._12_2_ = (ushort)((byte)(uVar40 >> 6) & 1) * auVar44._12_2_;
                    auVar45._14_2_ = (ushort)((byte)(uVar40 >> 7) & 1) * auVar44._14_2_;
                    auVar45._16_2_ = (ushort)(bVar31 & 1) * auVar44._16_2_;
                    auVar45._18_2_ = (ushort)(bVar31 >> 1 & 1) * auVar44._18_2_;
                    auVar45._20_2_ = (ushort)(bVar31 >> 2 & 1) * auVar44._20_2_;
                    auVar45._22_2_ = (ushort)(bVar31 >> 3 & 1) * auVar44._22_2_;
                    auVar45._24_2_ = (ushort)(bVar31 >> 4 & 1) * auVar44._24_2_;
                    auVar45._26_2_ = (ushort)(bVar31 >> 5 & 1) * auVar44._26_2_;
                    auVar45._28_2_ = (ushort)(bVar31 >> 6 & 1) * auVar44._28_2_;
                    auVar45._30_2_ = (ushort)(bVar31 >> 7) * auVar44._30_2_;
                    auVar49 = vpmovzxwd_avx512f(auVar45);
                    auVar49 = vpslld_avx512f(auVar49,0x10);
                    auVar49 = vmaxps_avx512f(auVar49,ZEXT1664(ZEXT816(0) << 0x40));
                    puVar1 = (uint *)((long)pvVar16 +
                                     uVar37 * 4 +
                                     lVar35 * sVar13 + lVar39 * sVar12 + lVar33 * sVar14);
                    bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar40 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar40 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar40 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar40 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar40 >> 7) & 1);
                    bVar24 = (bool)(bVar31 >> 1 & 1);
                    bVar25 = (bool)(bVar31 >> 2 & 1);
                    bVar26 = (bool)(bVar31 >> 3 & 1);
                    bVar27 = (bool)(bVar31 >> 4 & 1);
                    bVar28 = (bool)(bVar31 >> 5 & 1);
                    bVar29 = (bool)(bVar31 >> 6 & 1);
                    *puVar1 = (uint)(bVar30 & 1) * auVar49._0_4_ |
                              (uint)!(bool)(bVar30 & 1) * *puVar1;
                    puVar1[1] = (uint)bVar17 * auVar49._4_4_ | (uint)!bVar17 * puVar1[1];
                    puVar1[2] = (uint)bVar18 * auVar49._8_4_ | (uint)!bVar18 * puVar1[2];
                    puVar1[3] = (uint)bVar19 * auVar49._12_4_ | (uint)!bVar19 * puVar1[3];
                    puVar1[4] = (uint)bVar20 * auVar49._16_4_ | (uint)!bVar20 * puVar1[4];
                    puVar1[5] = (uint)bVar21 * auVar49._20_4_ | (uint)!bVar21 * puVar1[5];
                    puVar1[6] = (uint)bVar22 * auVar49._24_4_ | (uint)!bVar22 * puVar1[6];
                    puVar1[7] = (uint)bVar23 * auVar49._28_4_ | (uint)!bVar23 * puVar1[7];
                    puVar1[8] = (uint)(bVar31 & 1) * auVar49._32_4_ |
                                (uint)!(bool)(bVar31 & 1) * puVar1[8];
                    puVar1[9] = (uint)bVar24 * auVar49._36_4_ | (uint)!bVar24 * puVar1[9];
                    puVar1[10] = (uint)bVar25 * auVar49._40_4_ | (uint)!bVar25 * puVar1[10];
                    puVar1[0xb] = (uint)bVar26 * auVar49._44_4_ | (uint)!bVar26 * puVar1[0xb];
                    puVar1[0xc] = (uint)bVar27 * auVar49._48_4_ | (uint)!bVar27 * puVar1[0xc];
                    puVar1[0xd] = (uint)bVar28 * auVar49._52_4_ | (uint)!bVar28 * puVar1[0xd];
                    puVar1[0xe] = (uint)bVar29 * auVar49._56_4_ | (uint)!bVar29 * puVar1[0xe];
                    puVar1[0xf] = (uint)(bVar31 >> 7) * auVar49._60_4_ |
                                  (uint)!(bool)(bVar31 >> 7) * puVar1[0xf];
                    uVar37 = uVar37 + 0x10;
                  } while ((lVar11 + 0xfU & 0xfffffffffffffff0) != uVar37);
                }
                lVar42 = lVar42 + 1;
              } while (lVar42 != lVar34);
            }
            return;
          }
          goto LAB_0012bff6;
        }
        goto LAB_0012bfda;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_BF16) goto LAB_0012bfd2;
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012bfda;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar43 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          sVar12 = dst->nb[1];
          sVar13 = dst->nb[2];
          sVar14 = dst->nb[3];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
          lVar42 = iVar4 * lVar34;
          lVar34 = lVar34 + lVar42;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar42) {
            return;
          }
          pvVar15 = pgVar6->data;
          lVar43 = lVar43 * lVar10;
          pvVar16 = dst->data;
          do {
            lVar33 = lVar42 / lVar43;
            lVar39 = lVar42 % lVar43;
            lVar35 = lVar39 / lVar10;
            lVar39 = lVar39 % lVar10;
            if (0 < lVar11) {
              lVar36 = 0;
              do {
                auVar52 = vmaxss_avx(ZEXT216(*(ushort *)
                                              ((long)pvVar15 +
                                              lVar36 * 2 +
                                              lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8)) <<
                                     0x10,ZEXT816(0) << 0x40);
                uVar51 = auVar52._0_4_;
                if (uVar51 < 0x7f800001) {
                  uVar40 = (ushort)(uVar51 + 0x7fff + (uVar51 >> 0x10 & 1) >> 0x10);
                }
                else {
                  uVar40 = auVar52._2_2_ | 0x40;
                }
                *(ushort *)
                 ((long)pvVar16 + lVar36 * 2 + lVar35 * sVar13 + lVar39 * sVar12 + lVar33 * sVar14)
                     = uVar40;
                lVar36 = lVar36 + 1;
              } while (lVar11 != lVar36);
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 != lVar34);
          return;
        }
        goto LAB_0012bff6;
      }
    }
  }
  else if (gVar3 == GGML_TYPE_F16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_0012bfda;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar43 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          sVar12 = dst->nb[3];
          sVar13 = dst->nb[1];
          sVar14 = dst->nb[2];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
          lVar42 = iVar4 * lVar34;
          lVar34 = lVar34 + lVar42;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar42) {
            return;
          }
          lVar43 = lVar43 * lVar10;
          pvVar15 = dst->data;
          pvVar16 = pgVar6->data;
          do {
            lVar33 = lVar42 / lVar43;
            lVar39 = lVar42 % lVar43;
            lVar35 = lVar39 / lVar10;
            lVar39 = lVar39 % lVar10;
            if (0 < lVar11) {
              lVar36 = 0;
              do {
                auVar52 = vmaxss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                      (ulong)*(ushort *)
                                                              ((long)pvVar16 +
                                                              lVar36 * 2 +
                                                              lVar35 * sVar7 +
                                                              lVar39 * sVar9 + lVar33 * sVar8) * 4))
                                     ,ZEXT816(0) << 0x40);
                *(int *)((long)pvVar15 +
                        lVar36 * 4 + lVar35 * sVar14 + lVar39 * sVar13 + lVar33 * sVar12) =
                     auVar52._0_4_;
                lVar36 = lVar36 + 1;
              } while (lVar11 != lVar36);
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 != lVar34);
          return;
        }
LAB_0012bff6:
        pcVar38 = "nb00 == sizeof(src0_t)";
        uVar41 = 0x56;
        goto LAB_0012c010;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_F16) goto LAB_0012bfd2;
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012bfda;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar43 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          iVar4 = params->nth;
          iVar5 = params->ith;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar4 + -1 + lVar33) / (long)iVar4;
          lVar42 = iVar5 * lVar34;
          lVar34 = lVar34 + lVar42;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar42) {
            return;
          }
          lVar43 = lVar43 * lVar10;
          do {
            lVar33 = lVar42 % lVar43;
            if (0 < lVar11) {
              lVar35 = 0;
              do {
                auVar52 = vmaxss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                      (ulong)*(ushort *)
                                                              ((long)pgVar6->data +
                                                              lVar35 * 2 +
                                                              (lVar33 / lVar10) * sVar7 +
                                                              (lVar33 % lVar10) * sVar9 +
                                                              (lVar42 / lVar43) * sVar8) * 4)),
                                     ZEXT816(0) << 0x40);
                auVar52 = vcvtps2ph_f16c(auVar52,0);
                vpextrw_avx(auVar52,0);
                lVar35 = lVar35 + 1;
              } while (lVar11 != lVar35);
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 != lVar34);
          return;
        }
        goto LAB_0012bff6;
      }
    }
  }
  else {
    if ((gVar3 != GGML_TYPE_F32) || (gVar2 != GGML_TYPE_F32)) {
LAB_0012bfd2:
      ggml_compute_forward_relu_cold_1();
LAB_0012bfda:
      pcVar38 = "nb0 == sizeof(dst_t)";
      uVar41 = 0x55;
      goto LAB_0012c010;
    }
    cVar32 = ggml_is_contiguous_1(pgVar6);
    if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
       (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012bfda;
      if (pgVar6->nb[0] == 4) {
        sVar7 = pgVar6->nb[2];
        sVar8 = pgVar6->nb[1];
        sVar9 = pgVar6->nb[3];
        lVar10 = pgVar6->ne[1];
        lVar43 = pgVar6->ne[2];
        lVar11 = dst->ne[0];
        sVar12 = dst->nb[2];
        sVar13 = dst->nb[3];
        sVar14 = dst->nb[1];
        iVar4 = params->ith;
        iVar5 = params->nth;
        lVar33 = ggml_nrows(pgVar6);
        lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
        lVar42 = iVar4 * lVar34;
        lVar34 = lVar34 + lVar42;
        if (lVar33 <= lVar34) {
          lVar34 = lVar33;
        }
        if (lVar34 <= lVar42) {
          return;
        }
        lVar43 = lVar43 * lVar10;
        pvVar15 = dst->data;
        pvVar16 = pgVar6->data;
        do {
          lVar33 = lVar42 / lVar43;
          lVar39 = lVar42 % lVar43;
          lVar35 = lVar39 / lVar10;
          lVar39 = lVar39 % lVar10;
          if (0 < lVar11) {
            lVar36 = 0;
            do {
              auVar52 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar16 +
                                                    lVar36 * 4 +
                                                    lVar35 * sVar7 + lVar39 * sVar8 + lVar33 * sVar9
                                                    )),ZEXT816(0) << 0x40);
              *(int *)((long)pvVar15 +
                      lVar36 * 4 + lVar35 * sVar12 + lVar39 * sVar14 + lVar33 * sVar13) =
                   auVar52._0_4_;
              lVar36 = lVar36 + 1;
            } while (lVar11 != lVar36);
          }
          lVar42 = lVar42 + 1;
        } while (lVar42 != lVar34);
        return;
      }
      goto LAB_0012bff6;
    }
  }
  pcVar38 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar41 = 0x51;
LAB_0012c010:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar41,"GGML_ASSERT(%s) failed",pcVar38);
}

Assistant:

void ggml_compute_forward_relu(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_relu>(params, dst);
}